

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.c
# Opt level: O0

uint16_t patch(dw_rom *rom,uint32_t address,uint32_t size,uint8_t *data)

{
  uint8_t *local_30;
  uint8_t *p;
  uint32_t i;
  uint8_t *data_local;
  uint32_t size_local;
  uint32_t address_local;
  dw_rom *rom_local;
  
  local_30 = rom->content + address;
  for (p._4_4_ = 0; p._4_4_ < size; p._4_4_ = p._4_4_ + 1) {
    *local_30 = data[p._4_4_];
    local_30 = local_30 + 1;
  }
  return (short)local_30 - (short)rom->content;
}

Assistant:

uint16_t patch(const dw_rom *rom, uint32_t address, const uint32_t size,
                      const uint8_t *data)
{
    uint32_t i;
    uint8_t *p;

    p = &rom->content[address];

    for (i=0; i < size; i++) {
        *(p++) = data[i];
    }
    return p - rom->content;
}